

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O3

BufferResult __thiscall
tonk::UDPSocket::onUnrecognizedSource
          (UDPSocket *this,UDPAddress *addr,uint64_t receiveUsec,DatagramBuffer datagram)

{
  atomic<int> *paVar1;
  Lock *__mutex;
  ostringstream *poVar2;
  byte bVar3;
  element_type *peVar4;
  strand_service *psVar5;
  pthread_mutex_t *ppVar6;
  Channel *pCVar7;
  ConnectionIdMap *pCVar8;
  raw_node *prVar9;
  implementation_type psVar10;
  scheduler_operation *psVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  HandshakeType HVar15;
  int iVar16;
  uint32_t uVar17;
  Connection *pCVar18;
  OutputWorker *pOVar19;
  uint64_t uVar20;
  Connection *this_00;
  scheduler_operation *psVar21;
  scheduler_operation *psVar22;
  uint64_t value;
  uint64_t value_00;
  raw_node *prVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  thread_info_base *ptVar27;
  ulong uVar28;
  uint8_t *data;
  Locker locker;
  long in_FS_OFFSET;
  bool bVar29;
  string local_1f0;
  Connection *local_1d0;
  scheduler_operation *local_1c8;
  UDPAddress *local_1c0;
  undefined1 local_1b8 [16];
  ostringstream aoStack_1a8 [32];
  scheduler_operation *psStack_188;
  func_type p_Stack_180;
  BufferAllocator *pBStack_178;
  scheduler_operation *psStack_170;
  BufferAllocator *local_168;
  ios_base local_138 [264];
  
  uVar28 = (ulong)datagram.Bytes;
  bVar3 = datagram.Data[uVar28 - 3];
  if ((char)bVar3 < '\0') {
    if ((bVar3 & 0x40) == 0) {
      pCVar7 = (this->Deps).Logger;
      if ((int)pCVar7->ChannelMinLevel < 4) {
        local_1b8._0_8_ = pCVar7->ChannelName;
        poVar2 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,(pCVar7->Prefix)._M_dataplus._M_p,
                   (pCVar7->Prefix)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,
                   "Ignoring non-handshake packet from unrecognized source (bytes = ",0x40);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
        pOVar19 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar19,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_138);
      }
      LOCK();
      paVar1 = &((this->Deps).SocketRefCount)->RefCount;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      local_1f0._M_dataplus._M_p = local_1b8;
      local_1b8._8_8_ = *(undefined8 *)&(addr->impl_).data_;
      uVar12 = *(undefined8 *)((long)&(addr->impl_).data_ + 8);
      uVar13 = *(undefined8 *)((long)&(addr->impl_).data_ + 0x14);
      peVar4 = (this->AsioConnectStrand).
               super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      aoStack_1a8._8_4_ =
           (undefined4)((ulong)*(undefined8 *)((long)&(addr->impl_).data_ + 0xc) >> 0x20);
      aoStack_1a8._12_4_ = (undefined4)uVar13;
      aoStack_1a8._16_4_ = (undefined4)((ulong)uVar13 >> 0x20);
      aoStack_1a8._0_4_ = (undefined4)uVar12;
      aoStack_1a8._4_4_ = (undefined4)((ulong)uVar12 >> 0x20);
      psVar5 = peVar4->service_;
      if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
        ptVar27 = (thread_info_base *)0x0;
      }
      else {
        ptVar27 = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -0x10) + 8);
      }
      local_1b8._0_8_ = this;
      psVar21 = (scheduler_operation *)asio::detail::thread_info_base::allocate(ptVar27,0x40);
      psVar21->next_ = (scheduler_operation *)0x0;
      psVar21->func_ =
           asio::detail::
           completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:629:33)>
           ::do_complete;
      psVar21->task_result_ = 0;
      psVar21[1].next_ = (scheduler_operation *)local_1b8._0_8_;
      *(ulong *)&psVar21[1].field_0x14 = CONCAT44(aoStack_1a8._8_4_,aoStack_1a8._4_4_);
      *(ulong *)((long)&psVar21[2].next_ + 4) = CONCAT44(aoStack_1a8._16_4_,aoStack_1a8._12_4_);
      psVar21[1].func_ = (func_type)local_1b8._8_8_;
      *(ulong *)&psVar21[1].task_result_ = CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_);
      local_1f0._M_string_length = (size_type)psVar21;
      local_1f0.field_2._M_allocated_capacity = (size_type)psVar21;
      pthread_mutex_lock((pthread_mutex_t *)&peVar4->impl_->mutex_);
      psVar10 = peVar4->impl_;
      if (psVar10->locked_ == true) {
        psVar21->next_ = (scheduler_operation *)0x0;
        psVar11 = (psVar10->waiting_queue_).back_;
        psVar22 = (scheduler_operation *)&psVar10->waiting_queue_;
        if (psVar11 != (scheduler_operation *)0x0) {
          psVar22 = psVar11;
        }
        psVar22->next_ = psVar21;
        (psVar10->waiting_queue_).back_ = psVar21;
        pthread_mutex_unlock((pthread_mutex_t *)&peVar4->impl_->mutex_);
      }
      else {
        psVar10->locked_ = true;
        pthread_mutex_unlock((pthread_mutex_t *)&psVar10->mutex_);
        psVar10 = peVar4->impl_;
        psVar21->next_ = (scheduler_operation *)0x0;
        psVar11 = (psVar10->ready_queue_).back_;
        psVar22 = (scheduler_operation *)&psVar10->ready_queue_;
        if (psVar11 != (scheduler_operation *)0x0) {
          psVar22 = psVar11;
        }
        psVar22->next_ = psVar21;
        (psVar10->ready_queue_).back_ = psVar21;
        asio::detail::scheduler::post_immediate_completion
                  (psVar5->io_context_,&peVar4->impl_->super_operation,false);
      }
      local_1f0._M_string_length = 0;
      local_1f0.field_2._M_allocated_capacity = 0;
      asio::detail::
      completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:629:33)>
      ::ptr::reset((ptr *)&local_1f0);
      return Free;
    }
    data = datagram.Data + (uVar28 - 0x12);
    local_1c8 = (scheduler_operation *)receiveUsec;
    local_1c0 = addr;
    HVar15 = protocol::handshake::GetType(data);
    if (HVar15 != HandshakeType_Peer2PeerConnect) {
      if (HVar15 != HandshakeType_C2SUpdateSourceAddress) {
        if (HVar15 != HandshakeType_C2SConnectionRequest) {
          pCVar7 = (this->Deps).Logger;
          if (3 < (int)pCVar7->ChannelMinLevel) {
            return Free;
          }
          local_1b8._0_8_ = pCVar7->ChannelName;
          poVar2 = (ostringstream *)(local_1b8 + 0x10);
          local_1b8._8_4_ = Warning;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(pCVar7->Prefix)._M_dataplus._M_p,
                     (pCVar7->Prefix)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"Unrecognized handshake type",0x1b);
          pOVar19 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar19,(LogStringBuffer *)local_1b8);
          goto LAB_001343b1;
        }
        ppVar6 = (pthread_mutex_t *)(this->Deps).ReadBufferAllocator;
        iVar16 = pthread_mutex_lock(ppVar6);
        if (iVar16 == 0) {
          pktalloc::Allocator::Shrink((Allocator *)&ppVar6[1].__data,datagram.Data,datagram.Bytes);
          if (ppVar6 != (pthread_mutex_t *)0x0) {
            pthread_mutex_unlock(ppVar6);
          }
          local_1b8._8_8_ = protocol::handshake::GetKey(data);
          LOCK();
          paVar1 = &((this->Deps).SocketRefCount)->RefCount;
          (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
          UNLOCK();
          peVar4 = (this->AsioConnectStrand).
                   super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar12 = *(undefined8 *)((long)&(local_1c0->impl_).data_ + 0x14);
          uVar13 = *(undefined8 *)&(local_1c0->impl_).data_;
          uVar14 = *(undefined8 *)((long)&(local_1c0->impl_).data_ + 8);
          local_1f0._M_dataplus._M_p = local_1b8;
          aoStack_1a8._16_4_ =
               (undefined4)((ulong)*(undefined8 *)((long)&(local_1c0->impl_).data_ + 0xc) >> 0x20);
          aoStack_1a8._20_4_ = (undefined4)uVar12;
          aoStack_1a8._24_4_ = (undefined4)((ulong)uVar12 >> 0x20);
          aoStack_1a8._0_4_ = (undefined4)uVar13;
          aoStack_1a8._4_4_ = (undefined4)((ulong)uVar13 >> 0x20);
          aoStack_1a8._8_4_ = (undefined4)uVar14;
          aoStack_1a8._12_4_ = (undefined4)((ulong)uVar14 >> 0x20);
          p_Stack_180 = (func_type)datagram.Data;
          psStack_170 = (scheduler_operation *)datagram.FreePtr;
          local_168 = datagram.AllocatorForFree;
          psStack_188 = local_1c8;
          psVar5 = peVar4->service_;
          if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
            ptVar27 = (thread_info_base *)0x0;
          }
          else {
            ptVar27 = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -0x10) + 8);
          }
          local_1b8._0_8_ = this;
          pBStack_178 = (BufferAllocator *)datagram._8_8_;
          psVar21 = (scheduler_operation *)asio::detail::thread_info_base::allocate(ptVar27,0x70);
          psVar21->next_ = (scheduler_operation *)0x0;
          psVar21->func_ =
               asio::detail::
               completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:664:33)>
               ::do_complete;
          psVar21->task_result_ = 0;
          psVar21[1].next_ = (scheduler_operation *)local_1b8._0_8_;
          psVar21[1].func_ = (func_type)local_1b8._8_8_;
          *(ulong *)&psVar21[1].task_result_ = CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_);
          psVar21[2].next_ = (scheduler_operation *)CONCAT44(aoStack_1a8._12_4_,aoStack_1a8._8_4_);
          *(ulong *)((long)&psVar21[2].next_ + 4) = CONCAT44(aoStack_1a8._16_4_,aoStack_1a8._12_4_);
          *(ulong *)((long)&psVar21[2].func_ + 4) = CONCAT44(aoStack_1a8._24_4_,aoStack_1a8._20_4_);
          psVar21[3].next_ = psStack_188;
          psVar21[3].func_ = p_Stack_180;
          *(BufferAllocator **)&psVar21[3].task_result_ = pBStack_178;
          psVar21[4].next_ = psStack_170;
          psVar21[4].func_ = (func_type)local_168;
          local_1f0._M_string_length = (size_type)psVar21;
          local_1f0.field_2._M_allocated_capacity = (size_type)psVar21;
          pthread_mutex_lock((pthread_mutex_t *)&peVar4->impl_->mutex_);
          psVar10 = peVar4->impl_;
          if (psVar10->locked_ == true) {
            psVar21->next_ = (scheduler_operation *)0x0;
            psVar11 = (psVar10->waiting_queue_).back_;
            psVar22 = (scheduler_operation *)&psVar10->waiting_queue_;
            if (psVar11 != (scheduler_operation *)0x0) {
              psVar22 = psVar11;
            }
            psVar22->next_ = psVar21;
            (psVar10->waiting_queue_).back_ = psVar21;
            pthread_mutex_unlock((pthread_mutex_t *)&peVar4->impl_->mutex_);
          }
          else {
            psVar10->locked_ = true;
            pthread_mutex_unlock((pthread_mutex_t *)&psVar10->mutex_);
            psVar10 = peVar4->impl_;
            psVar21->next_ = (scheduler_operation *)0x0;
            psVar11 = (psVar10->ready_queue_).back_;
            psVar22 = (scheduler_operation *)&psVar10->ready_queue_;
            if (psVar11 != (scheduler_operation *)0x0) {
              psVar22 = psVar11;
            }
            psVar22->next_ = psVar21;
            (psVar10->ready_queue_).back_ = psVar21;
            asio::detail::scheduler::post_immediate_completion
                      (psVar5->io_context_,&peVar4->impl_->super_operation,false);
          }
          local_1f0._M_string_length = 0;
          local_1f0.field_2._M_allocated_capacity = 0;
          asio::detail::
          completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:664:33)>
          ::ptr::reset((ptr *)&local_1f0);
          return InUse;
        }
LAB_00134c65:
        std::__throw_system_error(iVar16);
      }
      uVar17 = protocol::handshake::GetConnectionId(data);
      uVar20 = protocol::handshake::GetKey(data);
      pCVar8 = (this->Deps).IdMap;
      __mutex = &pCVar8->IdLock;
      iVar16 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar16 != 0) goto LAB_00134c65;
      if ((pCVar8->IdMap).TheMap.m_num_valid == 0) {
LAB_00134bde:
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      else {
        uVar24 = uVar17 * -0x61c88647 >> ((byte)(pCVar8->IdMap).TheMap.m_hash_shift & 0x1f);
        prVar9 = (pCVar8->IdMap).TheMap.m_values;
        if (prVar9[uVar24].m_bits[0x10] == '\0') goto LAB_00134bde;
        prVar23 = prVar9 + uVar24;
        uVar25 = uVar24;
        if (*(uint32_t *)prVar23->m_bits != uVar17) {
          uVar26 = (pCVar8->IdMap).TheMap.m_values_count - 1;
          do {
            bVar29 = uVar25 == 0;
            prVar23 = prVar23 + -1;
            uVar25 = uVar25 - 1;
            if (bVar29) {
              prVar23 = prVar9 + uVar26;
              uVar25 = uVar26;
            }
            if ((uVar25 == uVar24) || (prVar23->m_bits[0x10] == '\0')) goto LAB_00134bde;
          } while (*(uint32_t *)prVar23->m_bits != uVar17);
        }
        if (((int)uVar25 < 0) ||
           (pCVar18 = *(Connection **)(prVar9[uVar25].m_bits + 8), pCVar18 == (Connection *)0x0))
        goto LAB_00134bde;
        LOCK();
        paVar1 = &(pCVar18->super_IConnection).SelfRefCount.RefCount;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (pCVar18->EncryptionKey == uVar20) {
          ppVar6 = (pthread_mutex_t *)(this->Deps).ReadBufferAllocator;
          local_1d0 = pCVar18;
          iVar16 = pthread_mutex_lock(ppVar6);
          if (iVar16 == 0) {
            pktalloc::Allocator::Shrink((Allocator *)&ppVar6[1].__data,datagram.Data,datagram.Bytes)
            ;
            if (ppVar6 != (pthread_mutex_t *)0x0) {
              pthread_mutex_unlock(ppVar6);
            }
            pCVar7 = (this->Deps).Logger;
            if ((int)pCVar7->ChannelMinLevel < 4) {
              local_1b8._0_8_ = pCVar7->ChannelName;
              poVar2 = (ostringstream *)(local_1b8 + 0x10);
              local_1b8._8_4_ = Warning;
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,(pCVar7->Prefix)._M_dataplus._M_p,
                         (pCVar7->Prefix)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"Switching connection address for ID ",0x24);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
              pOVar19 = logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(pOVar19,(LogStringBuffer *)local_1b8);
              std::__cxx11::ostringstream::~ostringstream(poVar2);
              std::ios_base::~ios_base(local_138);
            }
            LOCK();
            (local_1d0->PeerAddressChangesAllowed)._M_base._M_i = true;
            UNLOCK();
            Connection::OnUDPDatagram(local_1d0,(uint64_t)local_1c8,local_1c0,datagram);
            return InUse;
          }
          goto LAB_00134c65;
        }
        LOCK();
        paVar1 = &(pCVar18->super_IConnection).SelfRefCount.RefCount;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
        UNLOCK();
      }
      pCVar7 = (this->Deps).Logger;
      if (3 < (int)pCVar7->ChannelMinLevel) {
        return Free;
      }
      local_1b8._0_8_ = pCVar7->ChannelName;
      poVar2 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,(pCVar7->Prefix)._M_dataplus._M_p,
                 (pCVar7->Prefix)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Reconnect failed: Unrecognized ID ",0x22);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      pOVar19 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar19,(LogStringBuffer *)local_1b8);
LAB_001343b1:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
      std::ios_base::~ios_base(local_138);
      return Free;
    }
    pCVar18 = (Connection *)protocol::handshake::GetKey(data);
    this_00 = (Connection *)P2PConnectionKeyMap::FindByKey((this->Deps).P2PKeyMap,(key_t)pCVar18);
    if (this_00 != (Connection *)0x0) {
      ppVar6 = (pthread_mutex_t *)(this->Deps).ReadBufferAllocator;
      local_1d0 = pCVar18;
      iVar16 = pthread_mutex_lock(ppVar6);
      if (iVar16 == 0) {
        pktalloc::Allocator::Shrink((Allocator *)&ppVar6[1].__data,datagram.Data,datagram.Bytes);
        if (ppVar6 != (pthread_mutex_t *)0x0) {
          pthread_mutex_unlock(ppVar6);
        }
        Connection::OnP2PConnection
                  (this_00,(uint64_t)local_1c8,local_1c0,datagram,(uint64_t)local_1d0,
                   &this->AddressMap,&this->super_IUDPSender);
        return InUse;
      }
      goto LAB_00134c65;
    }
    pCVar7 = (this->Deps).Logger;
    HexString_abi_cxx11_(&local_1f0,(tonk *)pCVar18,value_00);
    if (3 < (int)pCVar7->ChannelMinLevel) goto LAB_00134568;
    local_1b8._0_8_ = pCVar7->ChannelName;
    poVar2 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._8_4_ = Warning;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(pCVar7->Prefix)._M_dataplus._M_p,(pCVar7->Prefix)._M_string_length
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Peer2Peer connection with unrecognized key = ",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    pOVar19 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar19,(LogStringBuffer *)local_1b8);
  }
  else {
    if ((datagram.Bytes != 5) || (bVar3 != 1)) {
      if ((6 < datagram.Bytes) &&
         ((bVar3 == 0 && (*(int *)(datagram.Data + (uVar28 - 7)) == 0x4b6e6f54)))) {
        if (this->SocketConfig->OnAdvertisement ==
            (_func_void_TonkAppContextPtr_TonkSocket_char_ptr_uint16_t_uint8_t_ptr_uint32_t *)0x0) {
          return Free;
        }
        LOCK();
        paVar1 = &((this->Deps).SocketRefCount)->RefCount;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        local_1f0._M_dataplus._M_p = local_1b8;
        uVar12 = *(undefined8 *)((long)&(addr->impl_).data_ + 0x14);
        peVar4 = (this->AsioConnectStrand).
                 super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1b8._8_8_ = *(undefined8 *)&(addr->impl_).data_;
        uVar13 = *(undefined8 *)((long)&(addr->impl_).data_ + 8);
        aoStack_1a8._8_4_ =
             (undefined4)((ulong)*(undefined8 *)((long)&(addr->impl_).data_ + 0xc) >> 0x20);
        aoStack_1a8._12_4_ = (undefined4)uVar12;
        aoStack_1a8._16_4_ = (undefined4)((ulong)uVar12 >> 0x20);
        aoStack_1a8._0_4_ = (undefined4)uVar13;
        aoStack_1a8._4_4_ = (undefined4)((ulong)uVar13 >> 0x20);
        aoStack_1a8._24_4_ = datagram.Data._0_4_;
        aoStack_1a8._28_4_ = datagram.Data._4_4_;
        p_Stack_180 = (func_type)datagram.FreePtr;
        pBStack_178 = datagram.AllocatorForFree;
        psVar5 = peVar4->service_;
        if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
          ptVar27 = (thread_info_base *)0x0;
        }
        else {
          ptVar27 = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -0x10) + 8);
        }
        local_1b8._0_8_ = this;
        psStack_188 = datagram._8_8_;
        psVar21 = (scheduler_operation *)asio::detail::thread_info_base::allocate(ptVar27,0x60);
        psVar21->next_ = (scheduler_operation *)0x0;
        psVar21->func_ =
             asio::detail::
             completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:595:37)>
             ::do_complete;
        psVar21->task_result_ = 0;
        psVar21[1].next_ = (scheduler_operation *)local_1b8._0_8_;
        *(ulong *)&psVar21[1].field_0x14 = CONCAT44(aoStack_1a8._8_4_,aoStack_1a8._4_4_);
        *(ulong *)((long)&psVar21[2].next_ + 4) = CONCAT44(aoStack_1a8._16_4_,aoStack_1a8._12_4_);
        psVar21[1].func_ = (func_type)local_1b8._8_8_;
        *(ulong *)&psVar21[1].task_result_ = CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_);
        *(ulong *)&psVar21[2].task_result_ = CONCAT44(aoStack_1a8._28_4_,aoStack_1a8._24_4_);
        psVar21[3].next_ = psStack_188;
        psVar21[3].func_ = p_Stack_180;
        *(BufferAllocator **)&psVar21[3].task_result_ = pBStack_178;
        local_1f0._M_string_length = (size_type)psVar21;
        local_1f0.field_2._M_allocated_capacity = (size_type)psVar21;
        pthread_mutex_lock((pthread_mutex_t *)&peVar4->impl_->mutex_);
        psVar10 = peVar4->impl_;
        if (psVar10->locked_ == true) {
          psVar21->next_ = (scheduler_operation *)0x0;
          psVar11 = (psVar10->waiting_queue_).back_;
          psVar22 = (scheduler_operation *)&psVar10->waiting_queue_;
          if (psVar11 != (scheduler_operation *)0x0) {
            psVar22 = psVar11;
          }
          psVar22->next_ = psVar21;
          (psVar10->waiting_queue_).back_ = psVar21;
          pthread_mutex_unlock((pthread_mutex_t *)&peVar4->impl_->mutex_);
        }
        else {
          psVar10->locked_ = true;
          pthread_mutex_unlock((pthread_mutex_t *)&psVar10->mutex_);
          psVar10 = peVar4->impl_;
          psVar21->next_ = (scheduler_operation *)0x0;
          psVar11 = (psVar10->ready_queue_).back_;
          psVar22 = (scheduler_operation *)&psVar10->ready_queue_;
          if (psVar11 != (scheduler_operation *)0x0) {
            psVar22 = psVar11;
          }
          psVar22->next_ = psVar21;
          (psVar10->ready_queue_).back_ = psVar21;
          asio::detail::scheduler::post_immediate_completion
                    (psVar5->io_context_,&peVar4->impl_->super_operation,false);
        }
        local_1f0._M_string_length = 0;
        local_1f0.field_2._M_allocated_capacity = 0;
        asio::detail::
        completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:595:37)>
        ::ptr::reset((ptr *)&local_1f0);
        return InUse;
      }
      pCVar7 = (this->Deps).Logger;
      if (3 < (int)pCVar7->ChannelMinLevel) {
        return Free;
      }
      local_1b8._0_8_ = pCVar7->ChannelName;
      poVar2 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,(pCVar7->Prefix)._M_dataplus._M_p,
                 (pCVar7->Prefix)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Ignoring unexpected unconnected type ",0x25);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2," from unrecognized source (bytes = ",0x23);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
      pOVar19 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar19,(LogStringBuffer *)local_1b8);
      goto LAB_001343b1;
    }
    uVar24 = CONCAT22(*(undefined2 *)(datagram.Data + (uVar28 - 5)),
                      *(undefined2 *)(datagram.Data + (uVar28 - 2)));
    pCVar18 = (Connection *)P2PConnectionKeyMap::FindByKey((this->Deps).P2PKeyMap,uVar24);
    if (pCVar18 != (Connection *)0x0) {
      Connection::OnNATProbe(pCVar18,addr,uVar24,&this->AddressMap,&this->super_IUDPSender);
      return Free;
    }
    pCVar7 = (this->Deps).Logger;
    HexString_abi_cxx11_(&local_1f0,(tonk *)(ulong)uVar24,value);
    if (3 < (int)pCVar7->ChannelMinLevel) goto LAB_00134568;
    local_1b8._0_8_ = pCVar7->ChannelName;
    poVar2 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._8_4_ = Warning;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(pCVar7->Prefix)._M_dataplus._M_p,(pCVar7->Prefix)._M_string_length
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"NAT probe received with key = ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," not found in map",0x11);
    pOVar19 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar19,(LogStringBuffer *)local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
  std::ios_base::~ios_base(local_138);
LAB_00134568:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  return Free;
}

Assistant:

UDPSocket::BufferResult UDPSocket::onUnrecognizedSource(
    const UDPAddress& addr,
    const uint64_t receiveUsec,
    DatagramBuffer datagram)
{
    /*
        Footer protocol:
            ...
            [Handshake (12 bytes)]
            <Timestamp (3 bytes)>
            <Flags (1 byte)>
            <Encryption Tag (2 bytes)>
    */
    const uint8_t* footer = datagram.Data + datagram.Bytes - protocol::kEncryptionTagBytes - protocol::kFlagsBytes;
    protocol::FlagsReader flags(footer[0]);

    // If this is an unconnected datagram:
    if (!flags.IsConnectionDatagram())
    {
        const unsigned unconnectedType = flags.GetUnconnectedType();

        // If this is a NAT probe:
        if (protocol::Unconnected_P2PNATProbe == unconnectedType &&
            protocol::kNATProbeBytes == datagram.Bytes)
        {
            uint32_t key = siamese::ReadU16_LE(footer - 2);
            key = (key << 16) | siamese::ReadU16_LE(footer + 1);

            // If there is a NAT probe in progress:
            IConnection* icon = Deps.P2PKeyMap->FindByKey(key);
            // Note the connection reference count was incremented by FindByKey()
            if (icon) {
                Connection* connection = reinterpret_cast<Connection*>(icon);
                connection->OnNATProbe(addr, key, &AddressMap, this);
            }
            else {
                Deps.Logger->Warning("NAT probe received with key = ", HexString(key), " not found in map");
            }

            return BufferResult::Free;
        }

        // If this is an advertisement
        if (protocol::Unconnected_Advertisement == unconnectedType &&
            protocol::kAdvertisementOverheadBytes <= datagram.Bytes &&
            protocol::kMagicAdvertisement == siamese::ReadU32_LE(footer - 4))
        {
            // If the application is not requesting advertisements, skip the async work
            if (!SocketConfig->OnAdvertisement) {
                return BufferResult::Free;
            }

            // Run callback in the connect strand to avoid blocking datagram processing
            Deps.SocketRefCount->IncrementReferences();
            AsioConnectStrand->post([this, addr, datagram]()
            {
                std::string ipString = addr.address().to_string();

                // Convert IP address to string and pass to app with data
                SocketConfig->OnAdvertisement(
                    SocketConfig->AppContextPtr,
                    APITonkSocket,
                    ipString.c_str(),
                    addr.port(),
                    datagram.Data,
                    datagram.Bytes - protocol::kAdvertisementOverheadBytes);

                datagram.Free();

                Deps.SocketRefCount->DecrementReferences();
            });

            return BufferResult::InUse;
        }

        // Unexpected type from unrecognized source
        Deps.Logger->Warning("Ignoring unexpected unconnected type ", unconnectedType, " from unrecognized source (bytes = ", datagram.Bytes, ")");

        return BufferResult::Free;
    }

    const unsigned handshakeBytes = flags.HandshakeBytes();
    if (handshakeBytes <= 0)
    {
        // Non-handshake from unrecognized source
        Deps.Logger->Warning("Ignoring non-handshake packet from unrecognized source (bytes = ", datagram.Bytes, ")");

        Deps.SocketRefCount->IncrementReferences();
        AsioConnectStrand->post([this, addr]()
        {
            DatagramBuffer datagram;
            datagram.AllocatorForFree = Deps.ReadBufferAllocator;
            datagram.Bytes = protocol::kS2CUnknownSourceBytes;
            datagram.Data = Deps.ReadBufferAllocator->Allocate(protocol::kS2CUnknownSourceBytes);
            datagram.FreePtr = datagram.Data;

            if (datagram.Data)
            {
                protocol::GenerateS2CUnknownSource(datagram.Data);
                Send(addr, datagram, Deps.SocketRefCount);
            }

            Deps.SocketRefCount->DecrementReferences();
        });

        return BufferResult::Free;
    }

    // Get pointer to the handshake data
    const uint8_t* handshakeData = footer - handshakeBytes - protocol::kTimestampBytes;

    // Decode handshake type
    const protocol::HandshakeType handshakeType = protocol::handshake::GetType(handshakeData);

    // If this is a connection request datagram:
    if (handshakeType == protocol::HandshakeType_C2SConnectionRequest)
    {
        // Shrink the datagram buffer before passing to connection
        Deps.ReadBufferAllocator->Shrink(datagram.Data, datagram.Bytes);

        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        Deps.SocketRefCount->IncrementReferences();
        AsioConnectStrand->post([this, key, addr, receiveUsec, datagram]()
        {
            onConnectRequest(key, addr, receiveUsec, datagram);
            Deps.SocketRefCount->DecrementReferences();
        });

        return BufferResult::InUse;
    }

    // If this is a peer2peer connection request:
    if (handshakeType == protocol::HandshakeType_Peer2PeerConnect)
    {
        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        // Note: The P2PKeyMap should match the low 4 bytes of the encryption key
        const uint32_t connKey = static_cast<uint32_t>(key);

        IConnection* icon = Deps.P2PKeyMap->FindByKey(connKey);
        // Note the connection reference count was incremented by FindByKey()

        // If there is a NAT probe in progress:
        if (icon)
        {
            // Shrink the datagram buffer before passing to connection
            Deps.ReadBufferAllocator->Shrink(datagram.Data, datagram.Bytes);

            Connection* connection = reinterpret_cast<Connection*>(icon);
            connection->OnP2PConnection(
                receiveUsec,
                addr,
                datagram,
                key,
                &AddressMap,
                this);
            return BufferResult::InUse;
        }

        Deps.Logger->Warning("Peer2Peer connection with unrecognized key = ", HexString(key));

        // Unrecognized connection request
        return BufferResult::Free;
    }

    // If this handshake is updating a source address:
    if (handshakeType == protocol::HandshakeType_C2SUpdateSourceAddress)
    {
        const uint32_t id = protocol::handshake::GetConnectionId(handshakeData);
        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        IConnection* icon = Deps.IdMap->FindById(id);
        // Note the connection reference count was incremented by FindById()
        if (icon)
        {
            Connection* connection = reinterpret_cast<Connection*>(icon);
            if (connection->GetEncryptionKey() == key)
            {
                // Shrink the datagram buffer before passing to connection
                Deps.ReadBufferAllocator->Shrink(datagram.Data, datagram.Bytes);

                Deps.Logger->Warning("Switching connection address for ID ", id);

                connection->PeerAddressChangesAllowed = true;

                connection->OnUDPDatagram(receiveUsec, addr, datagram);
                return BufferResult::InUse;
            }

            // FindById() has incremented the reference count, so decrement it here
            connection->SelfRefCount.DecrementReferences();
        }

        Deps.Logger->Warning("Reconnect failed: Unrecognized ID ", id);
        return BufferResult::Free;
    }

    // Not a handshake:
    Deps.Logger->Warning("Unrecognized handshake type");
    return BufferResult::Free;
}